

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O3

unit_data __thiscall units::detail::unit_data::root(unit_data *this,int power)

{
  bool bVar1;
  unit_data uVar2;
  unit_data local_34;
  
  bVar1 = hasValidRoot(this,power);
  uVar2 = (unit_data)0xfa94a488;
  if (bVar1) {
    uVar2 = *this;
    unit_data(&local_34,(((int)uVar2 << 0x1c) >> 0x1c) / power,
              (((int)uVar2 << 0x15) >> 0x1d) / power,((int)uVar2._0_1_ >> 4) / power,
              (((int)uVar2 << 0x12) >> 0x1d) / power,(((int)uVar2 << 0xd) >> 0x1d) / power,
              (((int)uVar2 << 0xb) >> 0x1e) / power,((int)uVar2._0_2_ >> 0xe) / power,
              (((int)uVar2 << 6) >> 0x1e) / power,(((int)uVar2 << 4) >> 0x1e) / power,
              (((int)uVar2 << 8) >> 0x1d) / power,(uint)uVar2 >> 0x1c & 1,
              (uint)uVar2 >> 0x1d & power & 1,(uint)uVar2 >> 0x1e & 1,0);
    uVar2 = local_34;
  }
  return uVar2;
}

Assistant:

constexpr unit_data root(int power) const
        {
            return (hasValidRoot(power)) ? unit_data(
                                               meter_ / power,
                                               kilogram_ / power,
                                               second_ / power,
                                               ampere_ / power,
                                               kelvin_ / power,
                                               mole_ / power,
                                               candela_ / power,
                                               currency_ / power,
                                               count_ / power,
                                               radians_ / power,
                                               per_unit_,
                                               (power % 2 == 0) ? 0U : i_flag_,
                                               e_flag_,
                                               0) :
                                           unit_data(nullptr);
        }